

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O1

void __thiscall hwnet::ThreadPool::TaskQueue::PostTask(TaskQueue *this,Ptr *task)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    if (this->closed == false) {
      std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
      push_back(&this->tasks,task);
      if (0 < this->watting) {
        std::_V2::condition_variable_any::notify_one(&this->cv);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ThreadPool::TaskQueue::PostTask(const Task::Ptr &task) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->closed) {
		return;
	}	
	this->tasks.push_back(task);
	if(this->watting > 0) {
		this->cv.notify_one();
	}
}